

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SocketLip.cpp
# Opt level: O1

void BaseSocket::SetTrafficDebugCallback
               (function<void_(unsigned_short,_const_char_*,_unsigned_long,_bool)> *fnCbTrafficDbg)

{
  _Any_data _Stack_28;
  _Manager_type local_18;
  
  std::function<void_(unsigned_short,_const_char_*,_unsigned_long,_bool)>::function
            ((function<void_(unsigned_short,_const_char_*,_unsigned_long,_bool)> *)&_Stack_28,
             fnCbTrafficDbg);
  std::function<void_(unsigned_short,_const_char_*,_unsigned_long,_bool)>::operator=
            (&BaseSocketImpl::s_fTrafficDebug,
             (function<void_(unsigned_short,_const_char_*,_unsigned_long,_bool)> *)&_Stack_28);
  if (local_18 != (code *)0x0) {
    (*local_18)(&_Stack_28,&_Stack_28,__destroy_functor);
  }
  return;
}

Assistant:

void BaseSocket::SetTrafficDebugCallback(std::function<void(const uint16_t, const char*, size_t, bool)> fnCbTrafficDbg)
{
    BaseSocketImpl::SetTrafficDebugCallback(fnCbTrafficDbg);
}